

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Fl_Window_Type::moveallchildren(Fl_Window_Type *this)

{
  bool bVar1;
  int iVar2;
  int local_50;
  int local_4c;
  int T;
  int R;
  int Y;
  int X;
  Fl_Widget_Type *myo2;
  Fl_Type *p;
  int t;
  int r;
  int y;
  int x;
  Fl_Widget_Type *myo;
  Fl_Type *i;
  Fl_Window_Type *this_local;
  
  i = (Fl_Type *)this;
  undo_checkpoint();
  myo = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
  while( true ) {
    bVar1 = false;
    if (myo != (Fl_Widget_Type *)0x0) {
      bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (myo->super_Fl_Type).level;
    }
    if (!bVar1) break;
    if ((((myo->super_Fl_Type).selected == '\0') ||
        (iVar2 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 == 0)) ||
       (iVar2 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar2 != 0)) {
      myo = (Fl_Widget_Type *)(myo->super_Fl_Type).next;
    }
    else {
      _y = myo;
      newposition(this,myo,&r,&t,(int *)((long)&p + 4),(int *)&p);
      (*_y->o->_vptr_Fl_Widget[4])
                (_y->o,(ulong)(uint)r,(ulong)(uint)t,(ulong)(uint)(p._4_4_ - r),
                 (ulong)(uint)((int)p - t));
      myo2 = (Fl_Widget_Type *)(_y->super_Fl_Type).next;
      while( true ) {
        bVar1 = false;
        if (myo2 != (Fl_Widget_Type *)0x0) {
          bVar1 = (_y->super_Fl_Type).level < (myo2->super_Fl_Type).level;
        }
        if (!bVar1) break;
        iVar2 = (*(myo2->super_Fl_Type)._vptr_Fl_Type[0x17])();
        if ((iVar2 != 0) && (iVar2 = (*(myo2->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar2 == 0)) {
          _Y = myo2;
          newposition(this,myo2,&R,&T,&local_4c,&local_50);
          (*_Y->o->_vptr_Fl_Widget[4])
                    (_Y->o,(ulong)(uint)R,(ulong)(uint)T,(ulong)(uint)(local_4c - R),
                     (ulong)(uint)(local_50 - T));
        }
        myo2 = (Fl_Widget_Type *)(myo2->super_Fl_Type).next;
      }
      myo = myo2;
    }
  }
  myo = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
  while( true ) {
    bVar1 = false;
    if (myo != (Fl_Widget_Type *)0x0) {
      bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (myo->super_Fl_Type).level;
    }
    if (!bVar1) break;
    fix_group_size(&myo->super_Fl_Type);
    myo = (Fl_Widget_Type *)(myo->super_Fl_Type).next;
  }
  Fl_Widget::redraw((this->super_Fl_Widget_Type).o);
  this->recalc = 1;
  Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
  set_modflag(1);
  this->dy = 0;
  this->dx = 0;
  update_xywh();
  return;
}

Assistant:

void Fl_Window_Type::moveallchildren()
{
  undo_checkpoint();
  Fl_Type *i;
  for (i=next; i && i->level>level;) {
    if (i->selected && i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      myo->o->resize(x,y,r-x,t-y);
      // move all the children, whether selected or not:
      Fl_Type* p;
      for (p = myo->next; p && p->level>myo->level; p = p->next)
	if (p->is_widget() && !p->is_menu_item()) {
	  Fl_Widget_Type* myo2 = (Fl_Widget_Type*)p;
	  int X,Y,R,T;
	  newposition(myo2,X,Y,R,T);
	  myo2->o->resize(X,Y,R-X,T-Y);
	}
      i = p;
    } else {
      i = i->next;
    }
  }
  for (i=next; i && i->level>level; i=i->next) 
    fix_group_size(i);
  o->redraw();
  recalc = 1;
  ((Overlay_Window *)(this->o))->redraw_overlay();
  set_modflag(1);
  dx = dy = 0;

  update_xywh();
}